

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_1::ValidateGroupNonUniformBallotBitCount
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint id;
  uint32_t uVar2;
  GroupOperation GVar3;
  Instruction *pIVar4;
  long lVar5;
  spv_result_t sVar6;
  char *pcVar7;
  string local_218;
  DiagnosticStream local_1f8;
  
  bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,(inst->inst_).type_id);
  if (bVar1) {
    id = Instruction::GetOperandAs<unsigned_int>(inst,4);
    pIVar4 = ValidationState_t::FindDef(_,id);
    uVar2 = (pIVar4->inst_).type_id;
    bVar1 = ValidationState_t::IsUnsignedIntVectorType(_,uVar2);
    if ((bVar1) && (uVar2 = ValidationState_t::GetDimension(_,uVar2), uVar2 == 4)) {
      GVar3 = Instruction::GetOperandAs<spv::GroupOperation>(inst,3);
      bVar1 = spvIsVulkanEnv(_->context_->target_env);
      if (GVar3 < ClusteredReduce) {
        return SPV_SUCCESS;
      }
      if (!bVar1) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_218,_,0x124d,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,local_218._M_dataplus._M_p,local_218._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,
                 "In Vulkan: The OpGroupNonUniformBallotBitCount group operation must be only: Reduce, InclusiveScan, or ExclusiveScan."
                 ,0x75);
      sVar6 = local_1f8.error_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0069eedd;
    }
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar7 = "Expected Value to be a vector of four components of integer type scalar";
    lVar5 = 0x47;
  }
  else {
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar7 = "Expected Result Type to be an unsigned integer type scalar.";
    lVar5 = 0x3b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar7,lVar5);
  sVar6 = local_1f8.error_;
LAB_0069eedd:
  DiagnosticStream::~DiagnosticStream(&local_1f8);
  return sVar6;
}

Assistant:

spv_result_t ValidateGroupNonUniformBallotBitCount(ValidationState_t& _,
                                                   const Instruction* inst) {
  // Scope is already checked by ValidateExecutionScope() above.

  const uint32_t result_type = inst->type_id();
  if (!_.IsUnsignedIntScalarType(result_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Result Type to be an unsigned integer type scalar.";
  }

  const auto value = inst->GetOperandAs<uint32_t>(4);
  const auto value_type = _.FindDef(value)->type_id();
  if (!_.IsUnsignedIntVectorType(value_type) ||
      _.GetDimension(value_type) != 4) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst) << "Expected Value to be a "
                                                   "vector of four components "
                                                   "of integer type scalar";
  }

  const auto group = inst->GetOperandAs<spv::GroupOperation>(3);
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if ((group != spv::GroupOperation::Reduce) &&
        (group != spv::GroupOperation::InclusiveScan) &&
        (group != spv::GroupOperation::ExclusiveScan)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4685)
             << "In Vulkan: The OpGroupNonUniformBallotBitCount group "
                "operation must be only: Reduce, InclusiveScan, or "
                "ExclusiveScan.";
    }
  }
  return SPV_SUCCESS;
}